

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTAudioEngine_Stop(FACTAudioEngine *pEngine,uint16_t nCategory,uint32_t dwFlags)

{
  ushort uVar1;
  short sVar2;
  LinkedList *pLVar3;
  FACTCue *pFVar4;
  ulong uVar5;
  uint32_t dwFlags_00;
  FACTCue *pCue;
  
  FAudio_PlatformLockMutex(pEngine->apiLock);
  pLVar3 = pEngine->sbList;
  do {
    if (pLVar3 == (LinkedList *)0x0) {
      FAudio_PlatformUnlockMutex(pEngine->apiLock);
      return 0;
    }
    pCue = *(FACTCue **)((long)pLVar3->entry + 8);
    while (pCue != (FACTCue *)0x0) {
      if (pCue->playingSound == (FACTSoundInstance *)0x0) {
LAB_0010b5a6:
        pCue = pCue->next;
      }
      else {
        uVar1 = pCue->playingSound->sound->category;
        uVar5 = (ulong)uVar1;
        if (uVar1 != nCategory) {
          while (sVar2 = pEngine->categories[uVar5].parentCategory, sVar2 != -1) {
            if ((int)sVar2 == (uint)nCategory) goto LAB_0010b558;
            uVar5 = (ulong)sVar2;
          }
          goto LAB_0010b5a6;
        }
LAB_0010b558:
        dwFlags_00 = dwFlags;
        if (dwFlags != 1) {
LAB_0010b59e:
          FACTCue_Stop(pCue,dwFlags_00);
          goto LAB_0010b5a6;
        }
        if (pCue->managed == '\0') {
          dwFlags_00 = 1;
          goto LAB_0010b59e;
        }
        pFVar4 = pCue->next;
        FACTCue_Destroy(pCue);
        pCue = pFVar4;
      }
    }
    pLVar3 = pLVar3->next;
  } while( true );
}

Assistant:

uint32_t FACTAudioEngine_Stop(
	FACTAudioEngine *pEngine,
	uint16_t nCategory,
	uint32_t dwFlags
) {
	FACTCue *cue, *backup;
	LinkedList *list;

	FAudio_PlatformLockMutex(pEngine->apiLock);
	list = pEngine->sbList;
	while (list != NULL)
	{
		cue = ((FACTSoundBank*) list->entry)->cueList;
		while (cue != NULL)
		{
			if (	cue->playingSound != NULL &&
				FACT_INTERNAL_IsInCategory(
					pEngine,
					nCategory,
					cue->playingSound->sound->category
				)	)
			{
				if (	dwFlags == FACT_FLAG_STOP_IMMEDIATE &&
					cue->managed	)
				{
					/* Just blow this up now */
					backup = cue->next;
					FACTCue_Destroy(cue);
					cue = backup;
				}
				else
				{
					/* If managed, the mixer will destroy for us */
					FACTCue_Stop(cue, dwFlags);
					cue = cue->next;
				}
			}
			else
			{
				cue = cue->next;
			}
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}